

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O0

void __thiscall
FBitmap::CopyPixelData
          (FBitmap *this,int originx,int originy,BYTE *patch,int srcwidth,int srcheight,int step_x,
          int step_y,int rotate,PalEntry *palette,FCopyInfo *inf)

{
  BYTE *pBVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ECopyOp local_46c;
  PalEntry *local_458;
  PalEntry local_448 [2];
  PalEntry penew [256];
  BYTE *buffer;
  int srcheight_local;
  int srcwidth_local;
  BYTE *patch_local;
  int originy_local;
  int originx_local;
  FBitmap *this_local;
  
  buffer._0_4_ = srcheight;
  buffer._4_4_ = srcwidth;
  _srcheight_local = patch;
  patch_local._0_4_ = originy;
  patch_local._4_4_ = originx;
  _originy_local = this;
  bVar2 = ClipCopyPixelRect(&this->ClipRect,(int *)((long)&patch_local + 4),(int *)&patch_local,
                            (BYTE **)&srcheight_local,(int *)((long)&buffer + 4),(int *)&buffer,
                            &step_x,&step_y,rotate);
  if (bVar2) {
    pBVar1 = this->data;
    iVar4 = patch_local._4_4_ << 2;
    iVar3 = this->Pitch * (int)patch_local;
    local_458 = local_448;
    do {
      PalEntry::PalEntry(local_458);
      local_458 = local_458 + 1;
    } while (local_458 != penew + 0xfe);
    memset(local_448,0,0x400);
    if ((inf != (FCopyInfo *)0x0) && (inf->blend != BLEND_NONE)) {
      iCopyColors<cPalEntry,cBGRA,bCopy>
                ((BYTE *)local_448,(BYTE *)palette,0x100,4,inf,'\0','\0','\0');
      palette = local_448;
    }
    if (inf == (FCopyInfo *)0x0) {
      local_46c = OP_COPY;
    }
    else {
      local_46c = inf->op;
    }
    (*copypalettedfuncs[local_46c])
              (pBVar1 + (long)iVar3 + (long)iVar4,_srcheight_local,buffer._4_4_,(int)buffer,
               this->Pitch,step_x,step_y,rotate,palette,inf);
  }
  return;
}

Assistant:

void FBitmap::CopyPixelData(int originx, int originy, const BYTE * patch, int srcwidth, int srcheight, 
										int step_x, int step_y, int rotate, PalEntry * palette, FCopyInfo *inf)
{
	if (ClipCopyPixelRect(&ClipRect, originx, originy, patch, srcwidth, srcheight, step_x, step_y, rotate))
	{
		BYTE *buffer = data + 4*originx + Pitch*originy;
		PalEntry penew[256];

		memset(penew, 0, sizeof(penew));
		if (inf && inf->blend)
		{
			iCopyColors<cPalEntry, cBGRA, bCopy>((BYTE*)penew, (const BYTE*)palette, 256, 4, inf, 0, 0, 0);
			palette = penew;
		}

		copypalettedfuncs[inf==NULL? OP_COPY : inf->op](buffer, patch, srcwidth, srcheight, Pitch, 
														step_x, step_y, rotate, palette, inf);
	}
}